

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O0

void __thiscall
anaPlanner::ReInitializeSearchStateInfo
          (anaPlanner *this,anaState *state,anaSearchStateSpace_t *pSearchStateSpace)

{
  int iVar1;
  anaSearchStateSpace_t *in_RDX;
  CMDPSTATE *in_RSI;
  anaPlanner *in_RDI;
  
  *(undefined4 *)
   ((long)&(in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 1000000000;
  *(undefined4 *)
   &(in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = 1000000000;
  *(undefined2 *)
   &(in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  *(unsigned_short *)
   ((long)&(in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = in_RDX->callnumber;
  in_RSI->PlannerSpecificData = (void *)0x0;
  in_RSI[1].StateID = 1000000000;
  *(undefined4 *)
   &(in_RSI->Actions).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  *(undefined8 *)in_RSI = 0;
  *(undefined2 *)
   ((long)&(in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  (in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (in_RDX->searchgoalstate == (CMDPSTATE *)0x0) {
    *(undefined4 *)&in_RSI[1].field_0x4 = 0;
  }
  else {
    iVar1 = ComputeHeuristic(in_RDI,in_RSI,in_RDX);
    *(int *)&in_RSI[1].field_0x4 = iVar1;
  }
  return;
}

Assistant:

void anaPlanner::ReInitializeSearchStateInfo(anaState* state, anaSearchStateSpace_t* pSearchStateSpace)
{
    state->g = INFINITECOST;
    state->v = INFINITECOST;
    state->iterationclosed = 0;
    state->callnumberaccessed = pSearchStateSpace->callnumber;
    state->bestnextstate = NULL;
    state->costtobestnextstate = INFINITECOST;
    state->heapindex = 0;
    state->listelem[ana_INCONS_LIST_ID] = 0;
    state->numofexpands = 0;

    state->bestpredstate = NULL;

    //compute heuristics
#if USE_HEUR

    if (pSearchStateSpace->searchgoalstate != NULL) {
        state->h = ComputeHeuristic(state->MDPstate, pSearchStateSpace);
    }
    else
    state->h = 0;

#else

    state->h = 0;

#endif

}